

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

void __thiscall
gl4cts::CopyOpsBufferStorageTestCase::initReferenceData(CopyOpsBufferStorageTestCase *this)

{
  long lVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  short sVar5;
  undefined1 auVar6 [16];
  unsigned_short *puVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar26;
  int iVar27;
  int iVar29;
  long lVar28;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  
  uVar2 = this->m_sparse_bo_size_rounded;
  lVar8 = (ulong)(uVar2 >> 1) - 1;
  auVar38._8_4_ = (int)lVar8;
  auVar38._0_8_ = lVar8;
  auVar38._12_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar38 = auVar38 ^ _DAT_019f5ce0;
  lVar8 = 0;
  do {
    puVar7 = (unsigned_short *)operator_new__((ulong)(uVar2 & 0xfffffffe));
    auVar6 = _DAT_019f5ce0;
    local_38 = auVar38._0_4_;
    iStack_34 = auVar38._4_4_;
    iStack_30 = auVar38._8_4_;
    iStack_2c = auVar38._12_4_;
    lVar1 = lVar8 + 1;
    this->m_ref_data[lVar8] = puVar7;
    if (1 < uVar2) {
      lVar8 = 0;
      auVar9 = _DAT_019fcc00;
      auVar10 = _DAT_01a25df0;
      auVar11 = _DAT_01a9b030;
      auVar12 = _DAT_01a9b020;
      do {
        auVar13 = auVar9 ^ auVar6;
        iVar19 = -(uint)(local_38 < auVar13._0_4_);
        iVar26 = -(uint)(iStack_34 < auVar13._4_4_);
        iVar27 = -(uint)(iStack_30 < auVar13._8_4_);
        iVar29 = -(uint)(iStack_2c < auVar13._12_4_);
        auVar20._4_4_ = iVar19;
        auVar20._0_4_ = iVar19;
        auVar20._8_4_ = iVar27;
        auVar20._12_4_ = iVar27;
        auVar33 = pshuflw(in_XMM7,auVar20,0xe8);
        auVar15._4_4_ = -(uint)(auVar13._4_4_ == iStack_34);
        auVar15._12_4_ = -(uint)(auVar13._12_4_ == iStack_2c);
        auVar15._0_4_ = auVar15._4_4_;
        auVar15._8_4_ = auVar15._12_4_;
        auVar35 = pshuflw(in_XMM8,auVar15,0xe8);
        auVar14._4_4_ = iVar26;
        auVar14._0_4_ = iVar26;
        auVar14._8_4_ = iVar29;
        auVar14._12_4_ = iVar29;
        auVar37 = pshuflw(in_XMM9,auVar14,0xe8);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        auVar13 = (auVar37 | auVar35 & auVar33) ^ auVar13;
        auVar13 = packssdw(auVar13,auVar13);
        lVar28 = auVar9._8_8_;
        sVar5 = (short)lVar1;
        if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)((long)puVar7 + lVar8) = (auVar9._0_2_ + 1) * sVar5;
        }
        auVar14 = auVar15 & auVar20 | auVar14;
        auVar15 = packssdw(auVar14,auVar14);
        auVar33._8_4_ = 0xffffffff;
        auVar33._0_8_ = 0xffffffffffffffff;
        auVar33._12_4_ = 0xffffffff;
        auVar15 = packssdw(auVar15 ^ auVar33,auVar15 ^ auVar33);
        if ((auVar15._0_4_ >> 0x10 & 1) != 0) {
          *(short *)((long)puVar7 + lVar8 + 2) = (auVar9._8_2_ + 1) * sVar5;
        }
        lVar16 = auVar10._8_8_;
        auVar15 = auVar10 ^ auVar6;
        iVar19 = -(uint)(local_38 < auVar15._0_4_);
        auVar34._4_4_ = -(uint)(iStack_34 < auVar15._4_4_);
        iVar26 = -(uint)(iStack_30 < auVar15._8_4_);
        auVar34._12_4_ = -(uint)(iStack_2c < auVar15._12_4_);
        auVar37._4_4_ = iVar19;
        auVar37._0_4_ = iVar19;
        auVar37._8_4_ = iVar26;
        auVar37._12_4_ = iVar26;
        auVar30._4_4_ = -(uint)(auVar15._4_4_ == iStack_34);
        auVar30._12_4_ = -(uint)(auVar15._12_4_ == iStack_2c);
        auVar30._0_4_ = auVar30._4_4_;
        auVar30._8_4_ = auVar30._12_4_;
        auVar34._0_4_ = auVar34._4_4_;
        auVar34._8_4_ = auVar34._12_4_;
        auVar15 = auVar30 & auVar37 | auVar34;
        auVar15 = packssdw(auVar15,auVar15);
        auVar35._8_4_ = 0xffffffff;
        auVar35._0_8_ = 0xffffffffffffffff;
        auVar35._12_4_ = 0xffffffff;
        auVar15 = packssdw(auVar15 ^ auVar35,auVar15 ^ auVar35);
        if ((auVar15 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)((long)puVar7 + lVar8 + 4) = (auVar10._0_2_ + 1) * sVar5;
        }
        auVar14 = pshufhw(auVar37,auVar37,0x84);
        auVar33 = pshufhw(auVar30,auVar30,0x84);
        auVar20 = pshufhw(auVar14,auVar34,0x84);
        auVar21._8_4_ = 0xffffffff;
        auVar21._0_8_ = 0xffffffffffffffff;
        auVar21._12_4_ = 0xffffffff;
        auVar21 = (auVar20 | auVar33 & auVar14) ^ auVar21;
        auVar14 = packssdw(auVar21,auVar21);
        if ((auVar14 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)((long)puVar7 + lVar8 + 6) = (auVar10._8_2_ + 1) * sVar5;
        }
        lVar17 = auVar11._8_8_;
        auVar14 = auVar11 ^ auVar6;
        iVar19 = -(uint)(local_38 < auVar14._0_4_);
        auVar23._4_4_ = -(uint)(iStack_34 < auVar14._4_4_);
        iVar26 = -(uint)(iStack_30 < auVar14._8_4_);
        auVar23._12_4_ = -(uint)(iStack_2c < auVar14._12_4_);
        auVar31._4_4_ = iVar19;
        auVar31._0_4_ = iVar19;
        auVar31._8_4_ = iVar26;
        auVar31._12_4_ = iVar26;
        auVar15 = pshuflw(auVar15,auVar31,0xe8);
        auVar22._4_4_ = -(uint)(auVar14._4_4_ == iStack_34);
        auVar22._12_4_ = -(uint)(auVar14._12_4_ == iStack_2c);
        auVar22._0_4_ = auVar22._4_4_;
        auVar22._8_4_ = auVar22._12_4_;
        in_XMM9 = pshuflw(auVar13,auVar22,0xe8);
        in_XMM9 = in_XMM9 & auVar15;
        auVar23._0_4_ = auVar23._4_4_;
        auVar23._8_4_ = auVar23._12_4_;
        auVar13 = pshuflw(auVar15,auVar23,0xe8);
        auVar36._8_4_ = 0xffffffff;
        auVar36._0_8_ = 0xffffffffffffffff;
        auVar36._12_4_ = 0xffffffff;
        auVar36 = (auVar13 | in_XMM9) ^ auVar36;
        auVar13 = packssdw(auVar36,auVar36);
        if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)((long)puVar7 + lVar8 + 8) = (auVar11._0_2_ + 1) * sVar5;
        }
        auVar23 = auVar22 & auVar31 | auVar23;
        auVar13 = packssdw(auVar23,auVar23);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar13 = packssdw(auVar13 ^ auVar3,auVar13 ^ auVar3);
        if ((auVar13 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(short *)((long)puVar7 + lVar8 + 10) = (auVar11._8_2_ + 1) * sVar5;
        }
        lVar18 = auVar12._8_8_;
        auVar13 = auVar12 ^ auVar6;
        iVar19 = -(uint)(local_38 < auVar13._0_4_);
        in_XMM7._4_4_ = -(uint)(iStack_34 < auVar13._4_4_);
        iVar26 = -(uint)(iStack_30 < auVar13._8_4_);
        in_XMM7._12_4_ = -(uint)(iStack_2c < auVar13._12_4_);
        auVar24._4_4_ = iVar19;
        auVar24._0_4_ = iVar19;
        auVar24._8_4_ = iVar26;
        auVar24._12_4_ = iVar26;
        auVar32._4_4_ = -(uint)(auVar13._4_4_ == iStack_34);
        auVar32._12_4_ = -(uint)(auVar13._12_4_ == iStack_2c);
        auVar32._0_4_ = auVar32._4_4_;
        auVar32._8_4_ = auVar32._12_4_;
        in_XMM7._0_4_ = in_XMM7._4_4_;
        in_XMM7._8_4_ = in_XMM7._12_4_;
        auVar13 = auVar32 & auVar24 | in_XMM7;
        auVar13 = packssdw(auVar13,auVar13);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        in_XMM8 = packssdw(auVar13 ^ auVar4,auVar13 ^ auVar4);
        if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)((long)puVar7 + lVar8 + 0xc) = (auVar12._0_2_ + 1) * sVar5;
        }
        auVar13 = pshufhw(auVar24,auVar24,0x84);
        auVar14 = pshufhw(auVar32,auVar32,0x84);
        auVar15 = pshufhw(auVar13,in_XMM7,0x84);
        auVar25._8_4_ = 0xffffffff;
        auVar25._0_8_ = 0xffffffffffffffff;
        auVar25._12_4_ = 0xffffffff;
        auVar25 = (auVar15 | auVar14 & auVar13) ^ auVar25;
        auVar13 = packssdw(auVar25,auVar25);
        if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)((long)puVar7 + lVar8 + 0xe) = (auVar12._8_2_ + 1) * sVar5;
        }
        auVar9._0_8_ = auVar9._0_8_ + 8;
        auVar9._8_8_ = lVar28 + 8;
        auVar10._0_8_ = auVar10._0_8_ + 8;
        auVar10._8_8_ = lVar16 + 8;
        auVar11._0_8_ = auVar11._0_8_ + 8;
        auVar11._8_8_ = lVar17 + 8;
        auVar12._0_8_ = auVar12._0_8_ + 8;
        auVar12._8_8_ = lVar18 + 8;
        lVar8 = lVar8 + 0x10;
      } while ((ulong)((uVar2 >> 1) + 7 & 0xfffffff8) * 2 != lVar8);
    }
    lVar8 = lVar1;
  } while (lVar1 != 3);
  return;
}

Assistant:

void CopyOpsBufferStorageTestCase::initReferenceData()
{
	DE_ASSERT(m_sparse_bo_size_rounded != 0);
	DE_ASSERT((m_sparse_bo_size_rounded % 2) == 0);
	DE_ASSERT(sizeof(short) == 2);

	for (unsigned int n_ref_data_buffer = 0; n_ref_data_buffer < sizeof(m_ref_data) / sizeof(m_ref_data[0]);
		 ++n_ref_data_buffer)
	{
		DE_ASSERT(m_ref_data[n_ref_data_buffer] == DE_NULL);

		m_ref_data[n_ref_data_buffer] = new unsigned short[m_sparse_bo_size_rounded / 2];

		/* Write reference values. */
		for (unsigned int n_short_value = 0; n_short_value < m_sparse_bo_size_rounded / 2; ++n_short_value)
		{
			m_ref_data[n_ref_data_buffer][n_short_value] =
				(unsigned short)((n_ref_data_buffer + 1) * (n_short_value + 1));
		}
	} /* for (all reference data buffers) */
}